

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

int message_get_footer(MESSAGE_HANDLE message,annotations *footer)

{
  LOGGER_LOG p_Var1;
  AMQP_VALUE pAVar2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  annotations *footer_local;
  MESSAGE_HANDLE message_local;
  
  if ((message == (MESSAGE_HANDLE)0x0) || (footer == (annotations *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                ,"message_get_footer",0x3d7,1,"Bad arguments: message = %p, footer = %p",message,
                footer);
    }
    l._4_4_ = 0x3d8;
  }
  else if (message->footer == (annotations)0x0) {
    *footer = (annotations)0x0;
    l._4_4_ = 0;
  }
  else {
    pAVar2 = amqpvalue_clone(message->footer);
    *footer = pAVar2;
    if (*footer == (annotations)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                  ,"message_get_footer",0x3ec,1,"Cannot clone message footer");
      }
      l._4_4_ = 0x3ed;
    }
    else {
      l._4_4_ = 0;
    }
  }
  return l._4_4_;
}

Assistant:

int message_get_footer(MESSAGE_HANDLE message, annotations* footer)
{
    int result;

    if ((message == NULL) ||
        (footer == NULL))
    {
        /* Codes_SRS_MESSAGE_01_083: [ If `message` or `footer` is NULL, `message_get_footer` shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: message = %p, footer = %p",
            message, footer);
        result = MU_FAILURE;
    }
    else
    {
        if (message->footer == NULL)
        {
            /* Codes_SRS_MESSAGE_01_152: [ If no footer has been set, `message_get_footer` shall set `footer` to NULL. ]*/
            *footer = NULL;

            /* Codes_SRS_MESSAGE_01_082: [ On success, `message_get_footer` shall return 0. ]*/
            result = 0;
        }
        else
        {
            /* Codes_SRS_MESSAGE_01_081: [ `message_get_footer` shall copy the contents of footer for the message instance identified by `message` into the argument `footer`. ]*/
            /* Codes_SRS_MESSAGE_01_084: [ Cloning the footer shall be done by calling `annotations_clone`. ]*/
            *footer = annotations_clone(message->footer);
            if (*footer == NULL)
            {
                /* Codes_SRS_MESSAGE_01_085: [ If `annotations_clone` fails, `message_get_footer` shall fail and return a non-zero value. ]*/
                LogError("Cannot clone message footer");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_MESSAGE_01_082: [ On success, `message_get_footer` shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}